

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O3

void co_resume(stCoRoutine_t *co)

{
  stCoRoutineEnv_t *psVar1;
  stCoRoutine_t *curr;
  int iVar2;
  
  psVar1 = co->env;
  iVar2 = psVar1->iCallStackSize;
  curr = psVar1->pCallStack[(long)iVar2 + -1];
  if (co->cStart == '\0') {
    coctx_make(&co->ctx,CoRoutineFunc,co,(void *)0x0);
    co->cStart = '\x01';
    iVar2 = psVar1->iCallStackSize;
  }
  psVar1->iCallStackSize = iVar2 + 1;
  psVar1->pCallStack[iVar2] = co;
  co_swap(curr,co);
  return;
}

Assistant:

void co_resume( stCoRoutine_t *co )
{
	stCoRoutineEnv_t *env = co->env;
	stCoRoutine_t *lpCurrRoutine = env->pCallStack[ env->iCallStackSize - 1 ];
	if( !co->cStart )
	{
		coctx_make( &co->ctx,(coctx_pfn_t)CoRoutineFunc,co,0 );
		co->cStart = 1;
	}
	env->pCallStack[ env->iCallStackSize++ ] = co;
	co_swap( lpCurrRoutine, co );


}